

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O3

void __thiscall cmCTestMultiProcessHandler::StartNextTests(cmCTestMultiProcessHandler *this)

{
  uv_timer_ptr *this_00;
  PropertiesMap *this_01;
  ulong uVar1;
  pointer pcVar2;
  cmCTest *pcVar3;
  unsigned_long uVar4;
  bool bVar5;
  uint uVar6;
  uv_timer_s *puVar7;
  ulong uVar8;
  mapped_type *ppcVar9;
  ostream *poVar10;
  uint64_t timeout;
  key_type *pkVar11;
  iterator __begin2;
  pointer piVar12;
  undefined8 unaff_R12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  double dVar16;
  SystemInformation info;
  TestList copy;
  string testWithMinProcessors;
  ostringstream cmCTestLog_msg;
  long *local_248;
  long local_240;
  long local_238 [2];
  ulong local_228;
  uint local_21c;
  ulong local_218;
  uv_timer_ptr *local_210;
  ulong local_208;
  SystemInformation local_200;
  key_type local_1f4;
  ulong local_1f0;
  vector<int,_std::allocator<int>_> local_1e8;
  char *local_1d0;
  long local_1c8;
  char local_1c0;
  undefined7 uStack_1bf;
  key_type *local_1b0;
  undefined1 local_1a8 [16];
  _func_int *local_198 [12];
  ios_base local_138 [264];
  
  this_00 = &this->TestLoadRetryTimer;
  puVar7 = ::cm::uv_handle_ptr_base_<uv_timer_s>::get((uv_handle_ptr_base_<uv_timer_s> *)this_00);
  if (puVar7 != (uv_timer_s *)0x0) {
    puVar7 = ::cm::uv_handle_ptr_::operator_cast_to_uv_timer_s_
                       (&this_00->super_uv_handle_ptr_<uv_timer_s>);
    uv_timer_stop(puVar7);
  }
  if ((this->Tests).
      super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ::cm::uv_handle_ptr_base_<uv_timer_s>::reset((uv_handle_ptr_base_<uv_timer_s> *)this_00);
    return;
  }
  bVar5 = CheckStopTimePassed(this);
  if (bVar5) {
    return;
  }
  bVar5 = cmCTest::GetStopOnFailure(this->CTest);
  if ((bVar5) &&
     ((this->Failed->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (this->Failed->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    return;
  }
  uVar15 = this->ParallelLevel;
  bVar5 = uVar15 < this->RunningCount;
  local_218 = uVar15 - this->RunningCount;
  uVar14 = 0;
  if (!bVar5) {
    uVar14 = local_218;
  }
  if (bVar5 || local_218 == 0) {
    return;
  }
  if (this->SerialTestRunning != false) {
    return;
  }
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = '\0';
  local_210 = this_00;
  cmsys::SystemInformation::SystemInformation(&local_200);
  uVar1 = this->TestLoad;
  if (uVar1 == 0) {
    local_208 = 0;
    local_1f0 = 0;
  }
  else {
    local_208 = this->FakeLoadForTesting;
    if (local_208 == 0) {
      dVar16 = cmsys::SystemInformation::GetLoadAverage(&local_200);
      dVar16 = ceil(dVar16);
      local_208 = (long)(dVar16 - 9.223372036854776e+18) & (long)dVar16 >> 0x3f | (long)dVar16;
      uVar8 = this->TestLoad;
    }
    else {
      this->FakeLoadForTesting = 1;
      uVar8 = uVar1;
    }
    local_1f0 = 0;
    if (local_208 <= uVar8) {
      local_1f0 = uVar8 - local_208;
    }
    local_218 = uVar14;
    if (local_1f0 <= uVar14) {
      local_218 = local_1f0;
    }
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_1e8,&(this->SortedTests).super_vector<int,_std::allocator<int>_>);
  if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    if (uVar1 == 0) goto LAB_002049b1;
  }
  else {
    local_21c = (uint)CONCAT71((int7)((ulong)unaff_R12 >> 8),uVar1 != 0);
    this_01 = &this->Properties;
    local_1b0 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    pkVar11 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    piVar12 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      if (this->SerialTestRunning != false) break;
      ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&this_01->
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,piVar12);
      if (((*ppcVar9)->RunSerial != true) || (uVar14 = local_218, this->RunningCount == 0)) {
        local_1a8._0_4_ = *piVar12;
        ppcVar9 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&this_01->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,(key_type *)local_1a8);
        local_228 = (long)(*ppcVar9)->Processors;
        if (this->ParallelLevel < (ulong)(long)(*ppcVar9)->Processors) {
          local_228 = this->ParallelLevel;
        }
        if (((this->HaveAffinity != 0) && (this->HaveAffinity < local_228)) &&
           (ppcVar9 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&this_01->
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,(key_type *)local_1a8), (*ppcVar9)->WantAffinity != false)) {
          local_228 = this->HaveAffinity;
        }
        if (this->TestLoad == 0) {
LAB_002044ad:
          bVar5 = false;
        }
        else {
          bVar5 = true;
          if (local_228 <= local_1f0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"OK to run ",10)
            ;
            local_1f4 = *piVar12;
            ppcVar9 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&this_01->
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,&local_1f4);
            local_248 = local_238;
            pcVar2 = ((*ppcVar9)->Name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_248,pcVar2,pcVar2 + ((*ppcVar9)->Name)._M_string_length);
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(char *)local_248,local_240);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,", it requires ",0xe);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10," procs & system load is: ",0x19);
            poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
            std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
            std::ostream::put((char)poVar10);
            std::ostream::flush();
            if (local_248 != local_238) {
              operator_delete(local_248,local_238[0] + 1);
            }
            pcVar3 = this->CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(pcVar3,0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                         ,0x232,(char *)local_248,false);
            if (local_248 != local_238) {
              operator_delete(local_248,local_238[0] + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            local_21c = 0;
            goto LAB_002044ad;
          }
        }
        if (local_228 <= uVar15) {
          local_248 = (long *)CONCAT44(local_248._4_4_,*piVar12);
          ppcVar9 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&this_01->
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,(key_type *)&local_248);
          pcVar2 = ((*ppcVar9)->Name)._M_dataplus._M_p;
          local_1a8._0_8_ = local_198;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_1a8,pcVar2,pcVar2 + ((*ppcVar9)->Name)._M_string_length);
          std::__cxx11::string::operator=((string *)&local_1d0,(string *)local_1a8);
          pkVar11 = local_1b0;
          uVar15 = local_228;
          if ((_func_int **)local_1a8._0_8_ != local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)(local_198[0] + 1));
            pkVar11 = local_1b0;
            uVar15 = local_228;
          }
        }
        uVar14 = local_218 - local_228;
        if (((bVar5 || local_218 < local_228) || (bVar5 = StartTest(this,*piVar12), !bVar5)) &&
           (uVar14 = local_218, local_218 == 0)) break;
      }
      local_218 = uVar14;
      piVar12 = piVar12 + 1;
    } while (piVar12 != pkVar11);
    if ((local_21c & 1) == 0) goto LAB_002049b1;
  }
  if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    bVar13 = 1;
  }
  else {
    bVar13 = 1;
    piVar12 = local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      ppcVar9 = std::
                map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                ::operator[](&(this->Properties).
                              super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                             ,piVar12);
      bVar13 = bVar13 & (*ppcVar9)->RunSerial;
      piVar12 = piVar12 + 1;
    } while (piVar12 !=
             local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"***** WAITING, ",0xf);
  pcVar3 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x24e,(char *)local_248,false);
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if (this->SerialTestRunning == true) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Waiting for RUN_SERIAL test to finish.",0x26);
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x252,(char *)local_248,false);
  }
  else if (bVar13 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"System Load: ",0xd);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", Max Allowed Load: ",0x14);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,", Smallest test ",0x10);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_1d0,local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10," requires ",10);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x25c,(char *)local_248,false);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Only RUN_SERIAL tests remain, awaiting available slot.",0x36);
    pcVar3 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar3,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                 ,0x255,(char *)local_248,false);
  }
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"*****",5);
  std::ios::widen((char)(ostream *)local_1a8 + (char)*(_func_int **)(local_1a8._0_8_ + -0x18));
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar3 = this->CTest;
  std::__cxx11::stringbuf::str();
  cmCTest::Log(pcVar3,5,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMultiProcessHandler.cxx"
               ,0x25f,(char *)local_248,false);
  if (local_248 != local_238) {
    operator_delete(local_248,local_238[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  uVar6 = cmSystemTools::RandomSeed();
  uVar4 = this->FakeLoadForTesting;
  puVar7 = ::cm::uv_handle_ptr_base_<uv_timer_s>::get((uv_handle_ptr_base_<uv_timer_s> *)local_210);
  if (puVar7 == (uv_timer_s *)0x0) {
    ::cm::uv_timer_ptr::init(local_210,(EVP_PKEY_CTX *)&this->Loop);
  }
  timeout = 10;
  if (uVar4 == 0) {
    timeout = (ulong)((uVar6 % 5) * 1000 + 1000);
  }
  ::cm::uv_timer_ptr::start(local_210,OnTestLoadRetryCB,timeout,0);
LAB_002049b1:
  if (local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (key_type *)0x0) {
    operator_delete(local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  cmsys::SystemInformation::~SystemInformation(&local_200);
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartNextTests()
{
  if (this->TestLoadRetryTimer.get() != nullptr) {
    // This timer may be waiting to call StartNextTests again.
    // Since we have been called it is no longer needed.
    uv_timer_stop(this->TestLoadRetryTimer);
  }

  if (this->Tests.empty()) {
    this->TestLoadRetryTimer.reset();
    return;
  }

  if (this->CheckStopTimePassed()) {
    return;
  }

  if (this->CheckStopOnFailure() && !this->Failed->empty()) {
    return;
  }

  size_t numToStart = 0;

  if (this->RunningCount < this->ParallelLevel) {
    numToStart = this->ParallelLevel - this->RunningCount;
  }

  if (numToStart == 0) {
    return;
  }

  // Don't start any new tests if one with the RUN_SERIAL property
  // is already running.
  if (this->SerialTestRunning) {
    return;
  }

  bool allTestsFailedTestLoadCheck = false;
  size_t minProcessorsRequired = this->ParallelLevel;
  std::string testWithMinProcessors;

  cmsys::SystemInformation info;

  unsigned long systemLoad = 0;
  size_t spareLoad = 0;
  if (this->TestLoad > 0) {
    // Activate possible wait.
    allTestsFailedTestLoadCheck = true;

    // Check for a fake load average value used in testing.
    if (this->FakeLoadForTesting > 0) {
      systemLoad = this->FakeLoadForTesting;
      // Drop the fake load for the next iteration to a value low enough
      // that the next iteration will start tests.
      this->FakeLoadForTesting = 1;
    }
    // If it's not set, look up the true load average.
    else {
      systemLoad = static_cast<unsigned long>(ceil(info.GetLoadAverage()));
    }
    spareLoad =
      (this->TestLoad > systemLoad ? this->TestLoad - systemLoad : 0);

    // Don't start more tests than the spare load can support.
    if (numToStart > spareLoad) {
      numToStart = spareLoad;
    }
  }

  TestList copy = this->SortedTests;
  for (auto const& test : copy) {
    // Take a nap if we're currently performing a RUN_SERIAL test.
    if (this->SerialTestRunning) {
      break;
    }
    // We can only start a RUN_SERIAL test if no other tests are also
    // running.
    if (this->Properties[test]->RunSerial && this->RunningCount > 0) {
      continue;
    }

    size_t processors = this->GetProcessorsUsed(test);
    bool testLoadOk = true;
    if (this->TestLoad > 0) {
      if (processors <= spareLoad) {
        cmCTestLog(this->CTest, DEBUG,
                   "OK to run " << this->GetName(test) << ", it requires "
                                << processors << " procs & system load is: "
                                << systemLoad << std::endl);
        allTestsFailedTestLoadCheck = false;
      } else {
        testLoadOk = false;
      }
    }

    if (processors <= minProcessorsRequired) {
      minProcessorsRequired = processors;
      testWithMinProcessors = this->GetName(test);
    }

    if (testLoadOk && processors <= numToStart && this->StartTest(test)) {
      numToStart -= processors;
    } else if (numToStart == 0) {
      break;
    }
  }

  if (allTestsFailedTestLoadCheck) {
    // Find out whether there are any non RUN_SERIAL tests left, so that the
    // correct warning may be displayed.
    bool onlyRunSerialTestsLeft = true;
    for (auto const& test : copy) {
      if (!this->Properties[test]->RunSerial) {
        onlyRunSerialTestsLeft = false;
      }
    }
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "***** WAITING, ");

    if (this->SerialTestRunning) {
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "Waiting for RUN_SERIAL test to finish.");
    } else if (onlyRunSerialTestsLeft) {
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "Only RUN_SERIAL tests remain, awaiting available slot.");
    } else {
      /* clang-format off */
      cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                 "System Load: " << systemLoad << ", "
                 "Max Allowed Load: " << this->TestLoad << ", "
                 "Smallest test " << testWithMinProcessors <<
                 " requires " << minProcessorsRequired);
      /* clang-format on */
    }
    cmCTestLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "*****" << std::endl);

    // Wait between 1 and 5 seconds before trying again.
    unsigned int milliseconds = (cmSystemTools::RandomSeed() % 5 + 1) * 1000;
    if (this->FakeLoadForTesting) {
      milliseconds = 10;
    }
    if (this->TestLoadRetryTimer.get() == nullptr) {
      this->TestLoadRetryTimer.init(this->Loop, this);
    }
    this->TestLoadRetryTimer.start(
      &cmCTestMultiProcessHandler::OnTestLoadRetryCB, milliseconds, 0);
  }
}